

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O0

void __thiscall despot::Navigation::PrintState(Navigation *this,State *s,ostream *out)

{
  int iVar1;
  ostream *this_00;
  void *this_01;
  const_reference pvVar2;
  int local_40;
  int pos;
  int x;
  int y;
  char buffer [20];
  ostream *out_local;
  State *s_local;
  Navigation *this_local;
  
  unique0x10000150 = out;
  this_00 = std::operator<<(out,"Flag = ");
  this_01 = (void *)std::ostream::operator<<(this_00,*(int *)(s + 0xc) % flag_size_);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  for (pos = 0; pos < this->ysize_; pos = pos + 1) {
    for (local_40 = 0; local_40 < this->xsize_; local_40 = local_40 + 1) {
      iVar1 = pos * this->xsize_ + local_40;
      if (iVar1 == this->goal_pos_) {
        if (*(int *)(s + 0xc) >> ((byte)flag_bits_ & 0x1f) == iVar1) {
          std::operator<<(stack0xffffffffffffffe0,"T     ");
        }
        else {
          std::operator<<(stack0xffffffffffffffe0,"G     ");
        }
      }
      else if (*(int *)(s + 0xc) >> ((byte)flag_bits_ & 0x1f) == iVar1) {
        std::operator<<(stack0xffffffffffffffe0,"R     ");
      }
      else {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->trap_prob_,(long)iVar1);
        sprintf((char *)&x,"%4.3f ",*pvVar2);
        std::operator<<(stack0xffffffffffffffe0,(char *)&x);
      }
    }
    std::ostream::operator<<(stack0xffffffffffffffe0,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Navigation::PrintState(const State& s, ostream& out) const {
	char buffer[20];
	out << "Flag = " << (s.state_id % flag_size_) << endl;
	for (int y = 0; y < ysize_; y++) {
		for (int x = 0; x < xsize_; x++) {
			int pos = y * xsize_ + x;
			if (pos == goal_pos_) {
				if ((s.state_id >> flag_bits_) == pos)
					out << "T     ";
				else
					out << "G     ";
			} else {
				if ((s.state_id >> flag_bits_) == pos)
					out << "R     ";
				else {
					sprintf(buffer, "%4.3f ", trap_prob_[pos]);
					out << buffer;
				}
			}
		}
		out << endl;
	}
}